

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  cmake *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  cmValue cVar4;
  char *extraout_RDX;
  string_view value;
  
  cVar4 = GetDefinition(this,var);
  if (cVar4.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
    return bVar2;
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  uVar3 = 1;
  if (pcVar1->DebugOutput == false) {
    uVar3 = pcVar1->Trace;
  }
  return (bool)uVar3;
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var) const
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if (cmValue val = this->GetDefinition(var)) {
    return cmIsOn(val);
  }
  // Enable optional policy warnings with --debug-output, --trace,
  // or --trace-expand.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}